

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSize __thiscall QDockAreaLayoutItem::maximumSize(QDockAreaLayoutItem *this)

{
  QMargins m;
  undefined8 uVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  QMargins QVar2;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QSize *in_stack_ffffffffffffffc0;
  QWidget *local_30;
  QSize in_stack_fffffffffffffff0;
  QDockAreaLayoutInfo *this_00;
  
  this_00 = *(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 0) {
    if (in_RDI[1] == 0) {
      QSize::QSize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    else {
      in_stack_fffffffffffffff0 = QDockAreaLayoutInfo::maximumSize(this_00);
    }
  }
  else {
    uVar1 = (**(code **)(*(long *)*in_RDI + 0x20))();
    (**(code **)(*(long *)*in_RDI + 0x68))();
    QVar2 = QWidget::contentsMargins(local_30);
    m.m_right.m_i = in_stack_fffffffffffffff0.wd.m_i;
    m.m_bottom.m_i = in_stack_fffffffffffffff0.ht.m_i;
    m.m_left.m_i = (int)uVar1;
    m.m_top.m_i = (int)((ulong)uVar1 >> 0x20);
    in_stack_fffffffffffffff0 = QSize::grownBy(QVar2._8_8_,m);
  }
  if (*(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28) == this_00) {
    return in_stack_fffffffffffffff0;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockAreaLayoutItem::maximumSize() const
{
    if (widgetItem)
        return widgetItem->maximumSize().grownBy(widgetItem->widget()->contentsMargins());
    if (subinfo != nullptr)
        return subinfo->maximumSize();
    return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
}